

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::PlyParser::PlyParser(PlyParser *this,FileName *fileName)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  _Node *p_Var8;
  mapped_type *elt;
  runtime_error *prVar9;
  pointer __k;
  string line;
  string signature;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  header;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::fstream::fstream(this);
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mesh).order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->mesh).elements._M_t._M_impl.super__Rb_tree_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mesh).elements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scene).ptr = (Node *)0x0;
  this->format = ASCII;
  std::fstream::open((char *)this,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_88 + 0x10;
    pcVar3 = (fileName->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar3,pcVar3 + (fileName->filename)._M_string_length);
    std::operator+(&local_68,"cannot open file : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::runtime_error::runtime_error(prVar9,(string *)&local_68);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)this,(string *)&local_68,cVar4);
  iVar5 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar5 == 0) {
    local_48._M_impl._M_node._M_size = 0;
    local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
    local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
    do {
      local_88._8_8_ = 0;
      local_88[0x10] = '\0';
      local_88._0_8_ = (Node *)(local_88 + 0x10);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)local_88,cVar4);
      iVar5 = std::__cxx11::string::compare(local_88);
      if (iVar5 != 0) {
        lVar7 = std::__cxx11::string::find((char)local_88,0x23);
        if (lVar7 != 0) {
          iVar6 = std::__cxx11::string::compare(local_88);
          if (iVar6 != 0) {
            p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                                &local_48,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88);
            std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
            local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
          }
        }
      }
      if ((Node *)local_88._0_8_ != (Node *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
    } while (iVar5 != 0);
    parseHeader(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48);
    __k = (this->mesh).order.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (__k != (this->mesh).order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        elt = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
              ::operator[](&(this->mesh).elements,__k);
        parseElementData(this,elt);
        __k = __k + 1;
      } while (__k != (this->mesh).order.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    import((PlyParser *)local_88);
    pNVar2 = (this->scene).ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
    (this->scene).ptr = (Node *)local_88._0_8_;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    return;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "invalid PLY file signature: ",&local_68);
  std::runtime_error::runtime_error(prVar9,(string *)local_88);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PlyParser(const FileName& fileName) : format(ASCII)
      {
        /* open file */
        fs.open (fileName.c_str(), std::fstream::in | std::fstream::binary);
        if (!fs.is_open()) throw std::runtime_error("cannot open file : " + fileName.str());

        /* check for file signature */
        std::string signature; getline(fs,signature);
        if (signature != "ply") throw std::runtime_error("invalid PLY file signature: " + signature);
        
        /* read header */
        std::list<std::string> header;
        while (true) {
          std::string line; getline(fs,line);
          if (line == "end_header") break;
          if (line.find_first_of('#') == 0) continue;
          if (line == "") continue;
          header.push_back(line);
        }

        /* parse header */
        parseHeader(header);

        /* now parse all elements */
        for (std::vector<std::string>::iterator i = mesh.order.begin(); i!=mesh.order.end(); i++)
          parseElementData(mesh.elements[*i]);

        /* create triangle mesh */
        scene = import();
      }